

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbgmsg.cpp
# Opt level: O1

void DBG_close_channels(void)

{
  FILE *pFVar1;
  int iVar2;
  uint uVar3;
  uint *puVar4;
  char *pcVar5;
  
  if (((output_file != (FILE *)0x0) && ((FILE *)output_file != _stderr)) && (output_file != _stdout)
     ) {
    iVar2 = fclose((FILE *)output_file);
    pFVar1 = _stderr;
    if (iVar2 != 0) {
      puVar4 = (uint *)__errno_location();
      uVar3 = *puVar4;
      pcVar5 = strerror(uVar3);
      fprintf(pFVar1,"ERROR : fclose() failed errno:%d (%s)\n",(ulong)uVar3,pcVar5);
    }
  }
  output_file = (FILE *)0x0;
  DeleteCriticalSection(&fprintf_crit_section);
  if (max_entry_level != 0) {
    uVar3 = pthread_key_delete(entry_level_key);
    pFVar1 = _stderr;
    if (uVar3 != 0) {
      pcVar5 = strerror(uVar3);
      fprintf(pFVar1,"ERROR : pthread_key_delete() returned %d! (%s)\n",(ulong)uVar3,pcVar5);
      return;
    }
  }
  return;
}

Assistant:

void DBG_close_channels()
{
    if(output_file && output_file != stderr && output_file != stdout)
    {
        if (fclose(output_file) != 0)
        {
            fprintf(stderr, "ERROR : fclose() failed errno:%d (%s)\n",
                   errno, strerror(errno));
        }
    }

    output_file = NULL;

    DeleteCriticalSection(&fprintf_crit_section);

    /* if necessary, release TLS key for entry nesting level */
    if(0 != max_entry_level)
    {
        int retval;

        retval = pthread_key_delete(entry_level_key);
        if(0 != retval)
        {
            fprintf(stderr, "ERROR : pthread_key_delete() returned %d! (%s)\n",
                    retval, strerror(retval));
        }
    }
}